

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

State __thiscall QAccessibleTableHeaderCell::state(QAccessibleTableHeaderCell *this)

{
  uint uVar1;
  QHeaderView *pQVar2;
  State SVar3;
  
  pQVar2 = headerView(this);
  if (pQVar2 == (QHeaderView *)0x0) {
    SVar3 = (State)0x0;
  }
  else {
    uVar1 = ((pQVar2->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
            data)->widget_attributes;
    SVar3._0_4_ = (uVar1 & 1) + (uVar1 & 0x8000) * 4 ^ 0x20000;
    SVar3._4_4_ = 0;
  }
  return SVar3;
}

Assistant:

QAccessible::State QAccessibleTableHeaderCell::state() const
{
    QAccessible::State s;
    if (QHeaderView *h = headerView()) {
        s.invisible = !h->testAttribute(Qt::WA_WState_Visible);
        s.disabled = !h->isEnabled();
    }
    return s;
}